

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_analysis.cpp
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::DominatorAnalysisBase::CommonDominator
          (DominatorAnalysisBase *this,BasicBlock *b1,BasicBlock *b2)

{
  size_type sVar1;
  bool bVar2;
  pair<std::__detail::_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false>,_bool> pVar3;
  byte local_91;
  BasicBlock *local_68;
  BasicBlock *block;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  seen;
  BasicBlock *b2_local;
  BasicBlock *b1_local;
  DominatorAnalysisBase *this_local;
  
  if ((b1 == (BasicBlock *)0x0) || (b2 == (BasicBlock *)0x0)) {
    this_local = (DominatorAnalysisBase *)0x0;
  }
  else {
    seen._M_h._M_single_bucket = (__node_base_ptr)b2;
    std::
    unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
    ::unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     *)&block);
    local_68 = b1;
    while( true ) {
      local_91 = 0;
      if (local_68 != (BasicBlock *)0x0) {
        pVar3 = std::
                unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ::insert((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                          *)&block,&local_68);
        local_91 = pVar3.second;
      }
      if ((local_91 & 1) == 0) break;
      local_68 = ImmediateDominator(this,local_68);
    }
    local_68 = (BasicBlock *)seen._M_h._M_single_bucket;
    while( true ) {
      bVar2 = false;
      if (local_68 != (BasicBlock *)0x0) {
        sVar1 = std::
                unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ::count((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                         *)&block,&local_68);
        bVar2 = sVar1 == 0;
      }
      if (!bVar2) break;
      local_68 = ImmediateDominator(this,local_68);
    }
    this_local = (DominatorAnalysisBase *)local_68;
    std::
    unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
    ::~unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      *)&block);
  }
  return (BasicBlock *)this_local;
}

Assistant:

BasicBlock* DominatorAnalysisBase::CommonDominator(BasicBlock* b1,
                                                   BasicBlock* b2) const {
  if (!b1 || !b2) return nullptr;

  std::unordered_set<BasicBlock*> seen;
  BasicBlock* block = b1;
  while (block && seen.insert(block).second) {
    block = ImmediateDominator(block);
  }

  block = b2;
  while (block && !seen.count(block)) {
    block = ImmediateDominator(block);
  }

  return block;
}